

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O3

void alsa_set_stream_state(cubeb_stream_conflict1 *stm,stream_state state)

{
  cubeb_conflict1 *pcVar1;
  int iVar2;
  
  pcVar1 = stm->context;
  stm->state = state;
  iVar2 = pthread_cond_broadcast((pthread_cond_t *)&stm->cond);
  if (iVar2 == 0) {
    pcVar1->rebuild = 1;
    write(pcVar1->control_fd_write,"x",1);
    return;
  }
  __assert_fail("r == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                ,0x135,"void alsa_set_stream_state(cubeb_stream *, enum stream_state)");
}

Assistant:

static void
alsa_set_stream_state(cubeb_stream * stm, enum stream_state state)
{
  cubeb * ctx;
  int r;

  ctx = stm->context;
  stm->state = state;
  r = pthread_cond_broadcast(&stm->cond);
  assert(r == 0);
  ctx->rebuild = 1;
  poll_wake(ctx);
}